

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstParamParser.cpp
# Opt level: O1

void __thiscall
SstParamParser::ParseParams(SstParamParser *this,IO *io,_SstParams *Params,UserOptions *userOptions)

{
  Params *this_00;
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  iterator iVar4;
  undefined8 *puVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  _Rb_tree_header *p_Var9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__endptr;
  string method;
  size_type __dnew;
  anon_class_8_1_3fcf65e4 lf_SetBoolParameter;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  anon_class_8_1_3fcf65e4 local_3a0;
  IO *local_398;
  key_type local_390;
  key_type local_370;
  string local_350;
  key_type local_330;
  string local_310;
  key_type local_2f0;
  key_type local_2d0;
  string local_2b0;
  key_type local_290;
  key_type local_270;
  key_type local_250;
  key_type local_230;
  key_type local_210;
  key_type local_1f0;
  string local_1d0;
  key_type local_1b0;
  key_type local_190;
  key_type local_170;
  key_type local_150;
  key_type local_130;
  key_type local_110;
  key_type local_f0;
  key_type local_d0;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  memset(Params,0,0xa8);
  Params->verbose = (userOptions->sst).verbose;
  Params->MarshalMethod = 2;
  local_3a0.io = io;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MarshalMethod","");
  this_00 = &io->m_Parameters;
  local_398 = io;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_70);
  p_Var9 = &(local_398->m_Parameters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
    local_460._M_allocated_capacity = (size_type)&local_450;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,*(long *)(iVar4._M_node + 2),
               (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
    uVar2 = local_460._8_8_;
    uVar8 = local_460._M_allocated_capacity;
    if (local_460._8_8_ != 0) {
      lVar10 = 0;
      do {
        iVar3 = tolower((int)*(char *)(uVar8 + lVar10));
        *(char *)(uVar8 + lVar10) = (char)iVar3;
        lVar10 = lVar10 + 1;
      } while (uVar2 != lVar10);
    }
    iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
    if (iVar3 == 0) {
      Params->MarshalMethod = 0;
    }
    else {
      iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
      if (iVar3 == 0) {
        Params->MarshalMethod = 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
        if (iVar3 == 0) {
          Params->MarshalMethod = 2;
        }
        else {
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
          local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
          local_420._M_string_length = 6;
          local_420.field_2._M_local_buf[6] = '\0';
          local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
          local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
          local_3e0.field_2._8_6_ = 0x726573726150;
          local_3e0._M_string_length = 0xe;
          local_3e0.field_2._M_local_buf[0xe] = '\0';
          local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
          local_400.field_2._7_4_ = 0x736d6172;
          local_400._M_string_length = 0xb;
          local_400.field_2._M_local_buf[0xb] = '\0';
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          std::operator+(&local_3c0,"Unknown Sst MarshalMethod parameter \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_460);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
          pcVar6 = (char *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6) {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440.field_2._8_8_ = puVar5[3];
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          }
          else {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_440._M_string_length = puVar5[1];
          *puVar5 = pcVar6;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          adios2::helper::Throw<std::invalid_argument>
                    (&local_420,&local_3e0,&local_400,&local_440,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_allocated_capacity != &local_450) {
      operator_delete((void *)local_460._M_allocated_capacity);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  Params->verbose = 0;
  paVar7 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"verbose","");
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_90);
  if ((_Rb_tree_header *)iVar4._M_node == p_Var9) {
LAB_006f88e2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar7) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    Params->RegistrationMethod = 0;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"RegistrationMethod","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_b0);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      local_460._M_allocated_capacity = (size_type)&local_450;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,*(long *)(iVar4._M_node + 2),
                 (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
      uVar2 = local_460._8_8_;
      uVar8 = local_460._M_allocated_capacity;
      if (local_460._8_8_ != 0) {
        lVar10 = 0;
        do {
          iVar3 = tolower((int)*(char *)(uVar8 + lVar10));
          *(char *)(uVar8 + lVar10) = (char)iVar3;
          lVar10 = lVar10 + 1;
        } while (uVar2 != lVar10);
      }
      iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
      if (iVar3 == 0) {
        Params->RegistrationMethod = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
        if (iVar3 == 0) {
          Params->RegistrationMethod = 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
          if (iVar3 == 0) {
            Params->RegistrationMethod = 2;
            local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
            local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
            local_420._M_string_length = 6;
            local_420.field_2._M_local_buf[6] = '\0';
            local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
            local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
            local_3e0.field_2._8_6_ = 0x726573726150;
            local_3e0._M_string_length = 0xe;
            local_3e0.field_2._M_local_buf[0xe] = '\0';
            local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
            local_400.field_2._7_4_ = 0x736d6172;
            local_400._M_string_length = 0xb;
            local_400.field_2._M_local_buf[0xb] = '\0';
            local_3c0._M_dataplus._M_p = (pointer)0x32;
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
            local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
            local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
            local_440._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)&local_3c0);
            local_440.field_2._M_allocated_capacity = (size_type)local_3c0._M_dataplus._M_p;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x20) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x21) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x22) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x23) = 'y';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x24) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x25) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x26) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x27) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x28) = 'm';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x29) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x2a) = 'l';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x2b) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x2c) = 'm';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x2d) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x2e) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x2f) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x10) = 'M';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x11) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x12) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x13) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x14) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x15) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x16) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x17) = '\"';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x18) = 'c';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x19) = 'l';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x1a) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x1b) = 'u';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x1c) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x1d) = '\"';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x1e) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x1f) = 'n';
            *(undefined8 *)local_440._M_dataplus._M_p = 0x6967655220747353;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 8) = 's';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 9) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 10) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0xb) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0xc) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0xd) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0xe) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0xf) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x30) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p + 0x31) = 'd';
            local_440._M_string_length = (size_type)local_3c0._M_dataplus._M_p;
            local_440._M_dataplus._M_p[(long)local_3c0._M_dataplus._M_p] = '\0';
            adios2::helper::Throw<std::invalid_argument>
                      (&local_420,&local_3e0,&local_400,&local_440,-1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p);
            }
          }
          else {
            local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
            local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
            local_420._M_string_length = 6;
            local_420.field_2._M_local_buf[6] = '\0';
            local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
            local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
            local_3e0.field_2._8_6_ = 0x726573726150;
            local_3e0._M_string_length = 0xe;
            local_3e0.field_2._M_local_buf[0xe] = '\0';
            local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
            local_400.field_2._7_4_ = 0x736d6172;
            local_400._M_string_length = 0xb;
            local_400.field_2._M_local_buf[0xb] = '\0';
            local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
            local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
            local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
            std::operator+(&local_3c0,"Unknown Sst RegistrationMethod parameter \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_460);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
            pcVar6 = (char *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar6) {
              local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
              local_440.field_2._8_8_ = puVar5[3];
              local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            }
            else {
              local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
              local_440._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_440._M_string_length = puVar5[1];
            *puVar5 = pcVar6;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            adios2::helper::Throw<std::invalid_argument>
                      (&local_420,&local_3e0,&local_400,&local_440,-1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
              operator_delete(local_3c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity != &local_450) {
        operator_delete((void *)local_460._M_allocated_capacity);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    Params->StepDistributionMode = 0;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"StepDistributionMode","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_d0);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      local_460._M_allocated_capacity = (size_type)&local_450;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,*(long *)(iVar4._M_node + 2),
                 (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
      uVar2 = local_460._8_8_;
      uVar8 = local_460._M_allocated_capacity;
      if (local_460._8_8_ != 0) {
        lVar10 = 0;
        do {
          iVar3 = tolower((int)*(char *)(uVar8 + lVar10));
          *(char *)(uVar8 + lVar10) = (char)iVar3;
          lVar10 = lVar10 + 1;
        } while (uVar2 != lVar10);
      }
      iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
      if (iVar3 == 0) {
        Params->StepDistributionMode = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
        if (iVar3 == 0) {
          Params->StepDistributionMode = 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
          if (iVar3 == 0) {
            Params->StepDistributionMode = 2;
          }
          else {
            local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
            local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
            local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
            local_420._M_string_length = 6;
            local_420.field_2._M_local_buf[6] = '\0';
            local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
            local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
            local_3e0.field_2._8_6_ = 0x726573726150;
            local_3e0._M_string_length = 0xe;
            local_3e0.field_2._M_local_buf[0xe] = '\0';
            local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
            local_400.field_2._7_4_ = 0x736d6172;
            local_400._M_string_length = 0xb;
            local_400.field_2._M_local_buf[0xb] = '\0';
            local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
            local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
            std::operator+(&local_3c0,"Unknown Sst StepDistributionMode parameter \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_460);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
            pcVar6 = (char *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar6) {
              local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
              local_440.field_2._8_8_ = puVar5[3];
              local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            }
            else {
              local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
              local_440._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_440._M_string_length = puVar5[1];
            *puVar5 = pcVar6;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            adios2::helper::Throw<std::invalid_argument>
                      (&local_420,&local_3e0,&local_400,&local_440,-1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
              operator_delete(local_3c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity != &local_450) {
        operator_delete((void *)local_460._M_allocated_capacity);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    Params->DataTransport = (char *)0x0;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"DataTransport","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_f0);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
      Params->DataTransport = pcVar6;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    Params->WANDataTransport = (char *)0x0;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"WANDataTransport","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_110);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
      Params->WANDataTransport = pcVar6;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    Params->OpenTimeoutSecs = 0x3c;
    paVar7 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"OpenTimeoutSecs","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_130);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      __endptr = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(iVar4._M_node + 2);
      __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)__errno_location();
      uVar1 = *(uint *)__nptr;
      pcVar6 = (char *)(ulong)uVar1;
      *(undefined4 *)__nptr = 0;
      lVar10 = strtol(__endptr->_M_local_buf,(char **)&local_460._M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity == __endptr) goto LAB_006fa3de;
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*(int *)__nptr != 0x22)) {
        if (*(int *)__nptr == 0) {
          *(uint *)__nptr = uVar1;
        }
        Params->OpenTimeoutSecs = (int)lVar10;
        goto LAB_006f90ff;
      }
      goto LAB_006fa3ea;
    }
LAB_006f90ff:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar7) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    Params->RendezvousReaderCount = 1;
    paVar7 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"RendezvousReaderCount","")
    ;
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_150);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      __endptr = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(iVar4._M_node + 2);
      __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)__errno_location();
      uVar1 = *(uint *)__nptr;
      pcVar6 = (char *)(ulong)uVar1;
      *(undefined4 *)__nptr = 0;
      lVar10 = strtol(__endptr->_M_local_buf,(char **)&local_460._M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity == __endptr) goto LAB_006fa3f6;
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*(int *)__nptr != 0x22)) {
        if (*(int *)__nptr == 0) {
          *(uint *)__nptr = uVar1;
        }
        Params->RendezvousReaderCount = (int)lVar10;
        goto LAB_006f91bf;
      }
      goto LAB_006fa402;
    }
LAB_006f91bf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar7) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    Params->QueueLimit = 0;
    paVar7 = &local_170.field_2;
    local_170._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"QueueLimit","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_170);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      __endptr = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(iVar4._M_node + 2);
      __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)__errno_location();
      uVar1 = *(uint *)__nptr;
      pcVar6 = (char *)(ulong)uVar1;
      *(undefined4 *)__nptr = 0;
      lVar10 = strtol(__endptr->_M_local_buf,(char **)&local_460._M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity == __endptr) goto LAB_006fa40e;
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*(int *)__nptr != 0x22)) {
        if (*(int *)__nptr == 0) {
          *(uint *)__nptr = uVar1;
        }
        Params->QueueLimit = (int)lVar10;
        goto LAB_006f927f;
      }
      goto LAB_006fa41a;
    }
LAB_006f927f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar7) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    Params->ReserveQueueLimit = 0;
    paVar7 = &local_190.field_2;
    local_190._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"ReserveQueueLimit","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_190);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      __endptr = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(iVar4._M_node + 2);
      __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)__errno_location();
      uVar1 = *(uint *)__nptr;
      pcVar6 = (char *)(ulong)uVar1;
      *(undefined4 *)__nptr = 0;
      lVar10 = strtol(__endptr->_M_local_buf,(char **)&local_460._M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity == __endptr) goto LAB_006fa426;
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*(int *)__nptr != 0x22)) {
        if (*(int *)__nptr == 0) {
          *(uint *)__nptr = uVar1;
        }
        Params->ReserveQueueLimit = (int)lVar10;
        goto LAB_006f933f;
      }
      goto LAB_006fa432;
    }
LAB_006f933f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar7) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    Params->QueueFullPolicy = 0;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"QueueFullPolicy","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_1b0);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      local_460._M_allocated_capacity = (size_type)&local_450;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,*(long *)(iVar4._M_node + 2),
                 (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
      uVar2 = local_460._8_8_;
      uVar8 = local_460._M_allocated_capacity;
      if (local_460._8_8_ != 0) {
        lVar10 = 0;
        do {
          iVar3 = tolower((int)*(char *)(uVar8 + lVar10));
          *(char *)(uVar8 + lVar10) = (char)iVar3;
          lVar10 = lVar10 + 1;
        } while (uVar2 != lVar10);
      }
      iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
      if (iVar3 == 0) {
        Params->QueueFullPolicy = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
        if (iVar3 == 0) {
          Params->QueueFullPolicy = 1;
        }
        else {
          local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
          local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
          local_420._M_string_length = 6;
          local_420.field_2._M_local_buf[6] = '\0';
          local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
          local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
          local_3e0.field_2._8_6_ = 0x726573726150;
          local_3e0._M_string_length = 0xe;
          local_3e0.field_2._M_local_buf[0xe] = '\0';
          local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
          local_400.field_2._7_4_ = 0x736d6172;
          local_400._M_string_length = 0xb;
          local_400.field_2._M_local_buf[0xb] = '\0';
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          std::operator+(&local_3c0,"Unknown Sst QueueFullPolicy parameter \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_460);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
          pcVar6 = (char *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6) {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440.field_2._8_8_ = puVar5[3];
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          }
          else {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_440._M_string_length = puVar5[1];
          *puVar5 = pcVar6;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          adios2::helper::Throw<std::invalid_argument>
                    (&local_420,&local_3e0,&local_400,&local_440,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity != &local_450) {
        operator_delete((void *)local_460._M_allocated_capacity);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    Params->IsRowMajor = 0;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"IsRowMajor","");
    Params->IsRowMajor = (uint)(local_398->m_ArrayOrder == RowMajor);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    Params->FirstTimestepPrecious = 0;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"FirstTimestepPrecious","")
    ;
    ParseParams::anon_class_8_1_3fcf65e4::operator()
              (&local_3a0,&local_1d0,&Params->FirstTimestepPrecious);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    Params->ControlTransport = (char *)0x0;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ControlTransport","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_1f0);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
      Params->ControlTransport = pcVar6;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    Params->NetworkInterface = (char *)0x0;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"NetworkInterface","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_210);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
      Params->NetworkInterface = pcVar6;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    Params->ControlInterface = (char *)0x0;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"ControlInterface","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_230);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
      Params->ControlInterface = pcVar6;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    Params->DataInterface = (char *)0x0;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"DataInterface","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_250);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
      Params->DataInterface = pcVar6;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    Params->CPCommPattern = 0;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CPCommPattern","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_270);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      local_460._M_allocated_capacity = (size_type)&local_450;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,*(long *)(iVar4._M_node + 2),
                 (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
      uVar2 = local_460._8_8_;
      uVar8 = local_460._M_allocated_capacity;
      if (local_460._8_8_ != 0) {
        lVar10 = 0;
        do {
          iVar3 = tolower((int)*(char *)(uVar8 + lVar10));
          *(char *)(uVar8 + lVar10) = (char)iVar3;
          lVar10 = lVar10 + 1;
        } while (uVar2 != lVar10);
      }
      iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
      if (iVar3 == 0) {
        Params->CPCommPattern = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
        if (iVar3 == 0) {
          Params->CPCommPattern = 1;
        }
        else {
          local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
          local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
          local_420._M_string_length = 6;
          local_420.field_2._M_local_buf[6] = '\0';
          local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
          local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
          local_3e0.field_2._8_6_ = 0x726573726150;
          local_3e0._M_string_length = 0xe;
          local_3e0.field_2._M_local_buf[0xe] = '\0';
          local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
          local_400.field_2._7_4_ = 0x736d6172;
          local_400._M_string_length = 0xb;
          local_400.field_2._M_local_buf[0xb] = '\0';
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          std::operator+(&local_3c0,"Unknown Sst CPCommPattern parameter \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_460);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
          pcVar6 = (char *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6) {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440.field_2._8_8_ = puVar5[3];
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          }
          else {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_440._M_string_length = puVar5[1];
          *puVar5 = pcVar6;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          adios2::helper::Throw<std::invalid_argument>
                    (&local_420,&local_3e0,&local_400,&local_440,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity != &local_450) {
        operator_delete((void *)local_460._M_allocated_capacity);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    Params->CompressionMethod = 0;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CompressionMethod","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_290);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      local_460._M_allocated_capacity = (size_type)&local_450;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,*(long *)(iVar4._M_node + 2),
                 (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
      uVar2 = local_460._8_8_;
      uVar8 = local_460._M_allocated_capacity;
      if (local_460._8_8_ != 0) {
        lVar10 = 0;
        do {
          iVar3 = tolower((int)*(char *)(uVar8 + lVar10));
          *(char *)(uVar8 + lVar10) = (char)iVar3;
          lVar10 = lVar10 + 1;
        } while (uVar2 != lVar10);
      }
      iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
      if (iVar3 == 0) {
        Params->CompressionMethod = 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
        if (iVar3 == 0) {
          Params->CompressionMethod = 0;
        }
        else {
          local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
          local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
          local_420._M_string_length = 6;
          local_420.field_2._M_local_buf[6] = '\0';
          local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
          local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
          local_3e0.field_2._8_6_ = 0x726573726150;
          local_3e0._M_string_length = 0xe;
          local_3e0.field_2._M_local_buf[0xe] = '\0';
          local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
          local_400.field_2._7_4_ = 0x736d6172;
          local_400._M_string_length = 0xb;
          local_400.field_2._M_local_buf[0xb] = '\0';
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          std::operator+(&local_3c0,"Unknown Sst CompressionMethod parameter \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_460);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
          pcVar6 = (char *)(puVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6) {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440.field_2._8_8_ = puVar5[3];
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          }
          else {
            local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
            local_440._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_440._M_string_length = puVar5[1];
          *puVar5 = pcVar6;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          adios2::helper::Throw<std::invalid_argument>
                    (&local_420,&local_3e0,&local_400,&local_440,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._M_dataplus._M_p != &local_420.field_2) {
            operator_delete(local_420._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity != &local_450) {
        operator_delete((void *)local_460._M_allocated_capacity);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    Params->AlwaysProvideLatestTimestep = 0;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"AlwaysProvideLatestTimestep","");
    ParseParams::anon_class_8_1_3fcf65e4::operator()
              (&local_3a0,&local_2b0,&Params->AlwaysProvideLatestTimestep);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    Params->SpeculativePreloadMode = 2;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"SpeculativePreloadMode","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_2d0);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      local_460._M_allocated_capacity = (size_type)&local_450;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_460,*(long *)(iVar4._M_node + 2),
                 (long)&(iVar4._M_node[2]._M_parent)->_M_color + *(long *)(iVar4._M_node + 2));
      uVar8 = local_460._M_allocated_capacity;
      if (local_460._8_8_ != 0) {
        lVar10 = 0;
        do {
          iVar3 = tolower((int)*(char *)(uVar8 + lVar10));
          *(char *)(uVar8 + lVar10) = (char)iVar3;
          lVar10 = lVar10 + 1;
        } while (local_460._8_8_ != lVar10);
      }
      iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
      if (iVar3 == 0) {
        Params->SpeculativePreloadMode = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
        if (iVar3 == 0) {
          Params->SpeculativePreloadMode = 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare(local_460._M_local_buf);
          if (iVar3 == 0) {
            Params->SpeculativePreloadMode = 2;
          }
          else {
            local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
            local_420.field_2._M_allocated_capacity._0_4_ = 0x69676e45;
            local_420.field_2._M_allocated_capacity._4_2_ = 0x656e;
            local_420._M_string_length = 6;
            local_420.field_2._M_local_buf[6] = '\0';
            local_3e0.field_2._M_allocated_capacity._0_6_ = 0x726150747353;
            local_3e0.field_2._M_allocated_capacity._6_2_ = 0x6d61;
            local_3e0.field_2._8_6_ = 0x726573726150;
            local_3e0._M_string_length = 0xe;
            local_3e0.field_2._M_local_buf[0xe] = '\0';
            local_400.field_2._M_allocated_capacity._0_7_ = 0x61506573726150;
            local_400.field_2._7_4_ = 0x736d6172;
            local_400._M_string_length = 0xb;
            local_400.field_2._M_local_buf[0xb] = '\0';
            local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
            local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
            std::operator+(&local_3c0,"Unknown Sst SpeculativePreloadMode parameter \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_460);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
            pcVar6 = (char *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar6) {
              local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
              local_440.field_2._8_8_ = puVar5[3];
              local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
            }
            else {
              local_440.field_2._M_allocated_capacity = *(undefined8 *)pcVar6;
              local_440._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_440._M_string_length = puVar5[1];
            *puVar5 = pcVar6;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            adios2::helper::Throw<std::invalid_argument>
                      (&local_420,&local_3e0,&local_400,&local_440,-1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != &local_440.field_2) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
              operator_delete(local_3c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) {
              operator_delete(local_420._M_dataplus._M_p);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity != &local_450) {
        operator_delete((void *)local_460._M_allocated_capacity);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    Params->SpecAutoNodeThreshold = 1;
    paVar11 = &local_2f0.field_2;
    local_2f0._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"SpecAutoNodeThreshold","")
    ;
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_2f0);
    if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
      __nptr = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)(iVar4._M_node + 2);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)__errno_location();
      uVar1 = *(uint *)paVar7;
      pcVar6 = (char *)(ulong)uVar1;
      *(uint *)paVar7 = 0;
      __endptr = &local_460;
      lVar10 = strtol(__nptr->_M_local_buf,(char **)&__endptr->_M_allocated_capacity,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_allocated_capacity == __nptr) goto LAB_006fa43e;
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*(uint *)paVar7 != 0x22)) {
        if (*(uint *)paVar7 == 0) {
          *(uint *)paVar7 = uVar1;
        }
        Params->SpecAutoNodeThreshold = (int)lVar10;
        goto LAB_006fa14a;
      }
      goto LAB_006fa44a;
    }
LAB_006fa14a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar11) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    Params->ReaderShortCircuitReads = 0;
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_310,"ReaderShortCircuitReads","");
    ParseParams::anon_class_8_1_3fcf65e4::operator()
              (&local_3a0,&local_310,&Params->ReaderShortCircuitReads);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    Params->StatsLevel = 0;
    paVar11 = &local_330.field_2;
    local_330._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"StatsLevel","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_330);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var9) {
LAB_006fa26b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar11) {
        operator_delete(local_330._M_dataplus._M_p);
      }
      Params->UseOneTimeAttributes = 0;
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,"UseOneTimeAttributes","");
      ParseParams::anon_class_8_1_3fcf65e4::operator()
                (&local_3a0,&local_350,&Params->UseOneTimeAttributes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p);
      }
      Params->RemoteGroup = (char *)0x0;
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"RemoteGroup","");
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,&local_370);
      if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
        pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
        Params->RemoteGroup = pcVar6;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      Params->ControlModule = (char *)0x0;
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"ControlModule","");
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,&local_390);
      if ((_Rb_tree_header *)iVar4._M_node != p_Var9) {
        pcVar6 = strdup(*(char **)(iVar4._M_node + 2));
        Params->ControlModule = pcVar6;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p);
      }
      return;
    }
    __nptr = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)(iVar4._M_node + 2);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__errno_location();
    uVar1 = *(uint *)paVar7;
    pcVar6 = (char *)(ulong)uVar1;
    *(uint *)paVar7 = 0;
    __endptr = &local_460;
    lVar10 = strtol(__nptr->_M_local_buf,(char **)&__endptr->_M_allocated_capacity,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_allocated_capacity != __nptr) {
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*(uint *)paVar7 != 0x22)) {
        if (*(uint *)paVar7 == 0) {
          *(uint *)paVar7 = uVar1;
        }
        Params->StatsLevel = (int)lVar10;
        goto LAB_006fa26b;
      }
      goto LAB_006fa462;
    }
  }
  else {
    __endptr = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)(iVar4._M_node + 2);
    __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__errno_location();
    uVar1 = *(uint *)__nptr;
    pcVar6 = (char *)(ulong)uVar1;
    *(undefined4 *)__nptr = 0;
    lVar10 = strtol(__endptr->_M_local_buf,(char **)&local_460._M_allocated_capacity,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_allocated_capacity == __endptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*(int *)__nptr != 0x22)) {
      if (*(int *)__nptr == 0) {
        *(uint *)__nptr = uVar1;
      }
      Params->verbose = (int)lVar10;
      goto LAB_006f88e2;
    }
    std::__throw_out_of_range("stoi");
LAB_006fa3de:
    std::__throw_invalid_argument("stoi");
LAB_006fa3ea:
    std::__throw_out_of_range("stoi");
LAB_006fa3f6:
    std::__throw_invalid_argument("stoi");
LAB_006fa402:
    std::__throw_out_of_range("stoi");
LAB_006fa40e:
    std::__throw_invalid_argument("stoi");
LAB_006fa41a:
    std::__throw_out_of_range("stoi");
LAB_006fa426:
    std::__throw_invalid_argument("stoi");
LAB_006fa432:
    paVar11 = &local_460;
    std::__throw_out_of_range("stoi");
LAB_006fa43e:
    std::__throw_invalid_argument("stoi");
LAB_006fa44a:
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_006fa462:
  uVar8 = std::__throw_out_of_range("stoi");
  if (local_440._M_dataplus._M_p != pcVar6) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != paVar11) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != __nptr) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != paVar7) {
    operator_delete(local_420._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_allocated_capacity != &local_450) {
    operator_delete((void *)local_460._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != __endptr) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

void SstParamParser::ParseParams(IO &io, struct _SstParams &Params,
                                 const adios2::UserOptions &userOptions)
{
    std::memset(&Params, 0, sizeof(Params));

    auto lf_SetBoolParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string value = itKey->second;
            std::transform(value.begin(), value.end(), value.begin(), ::tolower);
            if (value == "yes" || value == "true" || value == "on")
            {
                parameter = 1;
            }
            else if (value == "no" || value == "false" || value == "off")
            {
                parameter = 0;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst Boolean parameter \"" + value +
                                                         "\"");
            }
        }
    };
    auto lf_SetIntParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            parameter = std::stoi(itKey->second);
            return true;
        }
        return false;
    };

    auto lf_SetStringParameter = [&](const std::string key, char *&parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            parameter = strdup(itKey->second.c_str());
            return true;
        }
        return false;
    };

    auto lf_SetRegMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "file")
            {
                parameter = SstRegisterFile;
            }
            else if (method == "screen")
            {
                parameter = SstRegisterScreen;
            }
            else if (method == "cloud")
            {
                parameter = SstRegisterCloud;
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Sst RegistrationMethod "
                                                     "\"cloud\" not yet implemented");
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst RegistrationMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetCompressionMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "zfp")
            {
                parameter = SstCompressZFP;
            }
            else if (method == "none")
            {
                parameter = SstCompressNone;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst CompressionMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    // not really a parameter, but a convenient way to pass this around
    auto lf_SetIsRowMajorParameter = [&](const std::string key, int &parameter) {
        parameter = (io.m_ArrayOrder == adios2::ArrayOrdering::RowMajor);
        return true;
    };

    auto lf_SetMarshalMethodParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "ffs")
            {
                parameter = SstMarshalFFS;
            }
            else if (method == "bp")
            {
                parameter = SstMarshalBP;
            }
            else if (method == "bp5")
            {
                parameter = SstMarshalBP5;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst MarshalMethod parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetCPCommPatternParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "min")
            {
                parameter = SstCPCommMin;
            }
            else if (method == "peer")
            {
                parameter = SstCPCommPeer;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst CPCommPattern parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetQueueFullPolicyParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "block")
            {
                parameter = SstQueueFullBlock;
            }
            else if (method == "discard")
            {
                parameter = SstQueueFullDiscard;
            }
            else
            {
                helper::Throw<std::invalid_argument>("Engine", "SstParamParser", "ParseParams",
                                                     "Unknown Sst QueueFullPolicy parameter \"" +
                                                         method + "\"");
            }
            return true;
        }
        return false;
    };

    auto lf_SetStepDistributionModeParameter = [&](const std::string key, size_t &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "alltoall")
            {
                parameter = StepsAllToAll;
            }
            else if (method == "roundrobin")
            {
                parameter = StepsRoundRobin;
            }
            else if (method == "ondemand")
            {
                parameter = StepsOnDemand;
            }
            else
            {
                helper::Throw<std::invalid_argument>(
                    "Engine", "SstParamParser", "ParseParams",
                    "Unknown Sst StepDistributionMode parameter \"" + method + "\"");
            }
            return true;
        }
        return false;
    };
    auto lf_SetSpecPreloadModeParameter = [&](const std::string key, int &parameter) {
        auto itKey = io.m_Parameters.find(key);
        if (itKey != io.m_Parameters.end())
        {
            std::string method = itKey->second;
            std::transform(method.begin(), method.end(), method.begin(), ::tolower);
            if (method == "off")
            {
                parameter = SpecPreloadOff;
            }
            else if (method == "on")
            {
                parameter = SpecPreloadOn;
            }
            else if (method == "auto")
            {
                parameter = SpecPreloadAuto;
            }
            else
            {
                helper::Throw<std::invalid_argument>(
                    "Engine", "SstParamParser", "ParseParams",
                    "Unknown Sst SpeculativePreloadMode parameter \"" + method + "\"");
            }
            return true;
        }
        return false;
    };

    Params.verbose = userOptions.sst.verbose;

#define get_params(Param, Type, Typedecl, Default)                                                 \
    Params.Param = Default;                                                                        \
    lf_Set##Type##Parameter(#Param, Params.Param);
    SST_FOREACH_PARAMETER_TYPE_4ARGS(get_params);
#undef get_params
}